

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

bool __thiscall Js::FunctionBody::DoInterpreterProfile(FunctionBody *this)

{
  bool bVar1;
  uint sourceContextId;
  LocalFunctionId functionId;
  bool local_11;
  FunctionBody *this_local;
  
  sourceContextId = FunctionProxy::GetSourceContextId((FunctionProxy *)this);
  functionId = FunctionProxy::GetLocalFunctionId((FunctionProxy *)this);
  bVar1 = Phases::IsEnabled((Phases *)&DAT_01eafdf0,InterpreterProfilePhase,sourceContextId,
                            functionId);
  local_11 = false;
  if (!bVar1) {
    local_11 = DynamicProfileInfo::IsEnabled(this);
  }
  return local_11;
}

Assistant:

bool FunctionBody::DoInterpreterProfile() const
    {
#if ENABLE_PROFILE_INFO
        return !PHASE_OFF(InterpreterProfilePhase, this) && DynamicProfileInfo::IsEnabled(this);
#else
        return false;
#endif
    }